

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

ZSTD_frameProgression *
ZSTDMT_getFrameProgression(ZSTD_frameProgression *__return_storage_ptr__,ZSTDMT_CCtx *mtctx)

{
  uint uVar1;
  int iVar2;
  unsigned_long_long uVar3;
  size_t code;
  uint uVar4;
  uint uVar5;
  ZSTDMT_jobDescription *pZVar6;
  ulong local_60;
  ulong local_58;
  size_t flushed;
  size_t produced;
  size_t cResult;
  ZSTDMT_jobDescription *jobPtr;
  uint wJobID;
  uint lastJobNb;
  uint jobNb;
  ZSTDMT_CCtx *mtctx_local;
  
  __return_storage_ptr__->ingested = mtctx->consumed + (mtctx->inBuff).filled;
  __return_storage_ptr__->consumed = mtctx->consumed;
  uVar3 = mtctx->produced;
  __return_storage_ptr__->flushed = uVar3;
  __return_storage_ptr__->produced = uVar3;
  __return_storage_ptr__->currentJobID = mtctx->nextJobID;
  __return_storage_ptr__->nbActiveWorkers = 0;
  uVar1 = mtctx->nextJobID;
  iVar2 = mtctx->jobReady;
  if (1 < mtctx->jobReady) {
    __assert_fail("mtctx->jobReady <= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x4eb2,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
  }
  wJobID = mtctx->doneJobID;
  while( true ) {
    if (uVar1 + iVar2 <= wJobID) {
      return __return_storage_ptr__;
    }
    uVar4 = wJobID & mtctx->jobIDMask;
    pZVar6 = mtctx->jobs + uVar4;
    pthread_mutex_lock((pthread_mutex_t *)&pZVar6->job_mutex);
    code = pZVar6->cSize;
    uVar5 = ZSTD_isError(code);
    local_58 = code;
    if (uVar5 != 0) {
      local_58 = 0;
    }
    uVar5 = ZSTD_isError(code);
    if (uVar5 == 0) {
      local_60 = pZVar6->dstFlushed;
    }
    else {
      local_60 = 0;
    }
    if (local_58 < local_60) break;
    __return_storage_ptr__->ingested = (pZVar6->src).size + __return_storage_ptr__->ingested;
    __return_storage_ptr__->consumed = pZVar6->consumed + __return_storage_ptr__->consumed;
    __return_storage_ptr__->produced = local_58 + __return_storage_ptr__->produced;
    __return_storage_ptr__->flushed = local_60 + __return_storage_ptr__->flushed;
    __return_storage_ptr__->nbActiveWorkers =
         (uint)(pZVar6->consumed < (pZVar6->src).size) + __return_storage_ptr__->nbActiveWorkers;
    pthread_mutex_unlock((pthread_mutex_t *)&mtctx->jobs[uVar4].job_mutex);
    wJobID = wJobID + 1;
  }
  __assert_fail("flushed <= produced",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x4ebc,"ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx *)");
}

Assistant:

ZSTD_frameProgression ZSTDMT_getFrameProgression(ZSTDMT_CCtx* mtctx)
{
    ZSTD_frameProgression fps;
    DEBUGLOG(5, "ZSTDMT_getFrameProgression");
    fps.ingested = mtctx->consumed + mtctx->inBuff.filled;
    fps.consumed = mtctx->consumed;
    fps.produced = fps.flushed = mtctx->produced;
    fps.currentJobID = mtctx->nextJobID;
    fps.nbActiveWorkers = 0;
    {   unsigned jobNb;
        unsigned lastJobNb = mtctx->nextJobID + mtctx->jobReady; assert(mtctx->jobReady <= 1);
        DEBUGLOG(6, "ZSTDMT_getFrameProgression: jobs: from %u to <%u (jobReady:%u)",
                    mtctx->doneJobID, lastJobNb, mtctx->jobReady)
        for (jobNb = mtctx->doneJobID ; jobNb < lastJobNb ; jobNb++) {
            unsigned const wJobID = jobNb & mtctx->jobIDMask;
            ZSTDMT_jobDescription* jobPtr = &mtctx->jobs[wJobID];
            ZSTD_pthread_mutex_lock(&jobPtr->job_mutex);
            {   size_t const cResult = jobPtr->cSize;
                size_t const produced = ZSTD_isError(cResult) ? 0 : cResult;
                size_t const flushed = ZSTD_isError(cResult) ? 0 : jobPtr->dstFlushed;
                assert(flushed <= produced);
                fps.ingested += jobPtr->src.size;
                fps.consumed += jobPtr->consumed;
                fps.produced += produced;
                fps.flushed  += flushed;
                fps.nbActiveWorkers += (jobPtr->consumed < jobPtr->src.size);
            }
            ZSTD_pthread_mutex_unlock(&mtctx->jobs[wJobID].job_mutex);
        }
    }
    return fps;
}